

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidget::setCurrentPage(QCalendarWidget *this,int year,int month)

{
  QCalendarWidgetPrivate *this_00;
  int iVar1;
  int iVar2;
  QItemSelectionModel *pQVar3;
  long in_FS_OFFSET;
  undefined1 local_68 [24];
  int col;
  int row;
  QDate newDate;
  undefined8 local_40;
  qint64 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
  local_38 = (qint64)QCalendarWidgetPrivate::getCurrentDate(this_00);
  local_40 = *(undefined8 *)&this_00->m_model->m_calendar;
  iVar1 = QDate::day();
  iVar2 = QCalendar::daysInMonth((int)&local_40,month);
  if (iVar2 <= iVar1) {
    iVar1 = iVar2;
  }
  QCalendarWidgetPrivate::showMonth(this_00,year,month);
  newDate.jd = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  QDate::QDate(&newDate,year,month,iVar1,*(undefined8 *)&this_00->m_model->m_calendar);
  row = -1;
  col = -1;
  QtPrivate::QCalendarModel::cellForDate(this_00->m_model,newDate,&row,&col);
  if ((row != -1) && (col != -1)) {
    pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this_00->m_view);
    (**(code **)(*(long *)this_00->m_model + 0x60))(local_68,this_00->m_model,row,col);
    (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,local_68,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidget::setCurrentPage(int year, int month)
{
    Q_D(QCalendarWidget);
    QDate currentDate = d->getCurrentDate();
    QCalendar cal = d->m_model->m_calendar;
    int day = currentDate.day(cal);
    int daysInMonths = cal.daysInMonth(month, year);
    if (day > daysInMonths)
        day = daysInMonths;

    d->showMonth(year, month);

    QDate newDate(year, month, day, d->m_model->m_calendar);
    int row = -1, col = -1;
    d->m_model->cellForDate(newDate, &row, &col);
    if (row != -1 && col != -1) {
        d->m_view->selectionModel()->setCurrentIndex(d->m_model->index(row, col),
                                                  QItemSelectionModel::NoUpdate);
    }
}